

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O2

timeval google::protobuf::util::TimeUtil::TimestampToTimeval(Timestamp *value)

{
  int iVar1;
  timeval tVar2;
  
  iVar1 = value->nanos_;
  tVar2.tv_usec = (ulong)(0 < iVar1 % 1000 && iVar1 < -999) + (long)(iVar1 / 1000);
  tVar2.tv_sec = value->seconds_;
  return tVar2;
}

Assistant:

timeval TimeUtil::TimestampToTimeval(const Timestamp& value) {
  timeval result;
  result.tv_sec = value.seconds();
  result.tv_usec = RoundTowardZero(value.nanos(), kNanosPerMicrosecond);
  return result;
}